

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

float * Jf_ManInitRefs(Jf_Man_t *pMan)

{
  int iVar1;
  void *pvVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  float *pfVar6;
  bool bVar7;
  int local_44;
  int i;
  float *pRes;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *pCtrl;
  Gia_Obj_t *pObj;
  Gia_Man_t *p;
  Jf_Man_t *pMan_local;
  
  pObj = (Gia_Obj_t *)pMan->pGia;
  p = (Gia_Man_t *)pMan;
  if (((Gia_Man_t *)pObj)->pRefs == (int *)0x0) {
    iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
    pvVar2 = calloc((long)iVar1,4);
    *(void **)(pObj + 0xc) = pvVar2;
    local_44 = 0;
    while( true ) {
      bVar7 = false;
      if (local_44 < *(int *)(pObj + 2)) {
        pCtrl = Gia_ManObj((Gia_Man_t *)pObj,local_44);
        bVar7 = pCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(pCtrl);
      if (iVar1 != 0) {
        Gia_ObjRefFanin0Inc((Gia_Man_t *)pObj,pCtrl);
        iVar1 = Gia_ObjIsBuf(pCtrl);
        if (iVar1 == 0) {
          Gia_ObjRefFanin1Inc((Gia_Man_t *)pObj,pCtrl);
          iVar1 = Gia_ObjIsMuxType(pCtrl);
          if (iVar1 != 0) {
            pData0 = Gia_ObjRecognizeMux(pCtrl,(Gia_Obj_t **)&pRes,&pData1);
            pGVar5 = pObj;
            pGVar4 = Gia_Regular(pData0);
            Gia_ObjRefDec((Gia_Man_t *)pGVar5,pGVar4);
            pGVar4 = Gia_Regular((Gia_Obj_t *)pRes);
            pGVar3 = Gia_Regular(pData1);
            pGVar5 = pObj;
            if (pGVar4 == pGVar3) {
              pGVar4 = Gia_Regular((Gia_Obj_t *)pRes);
              Gia_ObjRefDec((Gia_Man_t *)pGVar5,pGVar4);
            }
          }
        }
      }
      local_44 = local_44 + 1;
    }
    local_44 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(*(Vec_Int_t **)(pObj + 6));
      bVar7 = false;
      if (local_44 < iVar1) {
        pCtrl = Gia_ManCo((Gia_Man_t *)pObj,local_44);
        bVar7 = pCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      Gia_ObjRefFanin0Inc((Gia_Man_t *)pObj,pCtrl);
      local_44 = local_44 + 1;
    }
    if (*(int *)(p->pSpec + 0x54) != 0) {
      *(undefined4 *)&p->pSibls = 0;
      local_44 = 0;
      while( true ) {
        bVar7 = false;
        if (local_44 < *(int *)(pObj + 2)) {
          pCtrl = Gia_ManObj((Gia_Man_t *)pObj,local_44);
          bVar7 = pCtrl != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        iVar1 = Gia_ObjIsAnd(pCtrl);
        if ((iVar1 != 0) && (iVar1 = Gia_ObjIsMuxType(pCtrl), pGVar5 = pObj, iVar1 != 0)) {
          pGVar4 = Gia_ObjFanin0(pCtrl);
          iVar1 = Gia_ObjRefNum((Gia_Man_t *)pGVar5,pGVar4);
          if (iVar1 == 1) {
            pGVar5 = Gia_ObjFanin0(pCtrl);
            pGVar5 = Gia_ObjFanin0(pGVar5);
            Jf_ObjSetUnit(pGVar5);
            pGVar5 = Gia_ObjFanin1(pCtrl);
            pGVar5 = Gia_ObjFanin0(pGVar5);
            Jf_ObjSetUnit(pGVar5);
            pGVar5 = Gia_ObjFanin0(pCtrl);
            Jf_ObjCleanUnit(pGVar5);
            *(int *)&p->pSibls = *(int *)&p->pSibls + 1;
          }
          pGVar5 = pObj;
          pGVar4 = Gia_ObjFanin1(pCtrl);
          iVar1 = Gia_ObjRefNum((Gia_Man_t *)pGVar5,pGVar4);
          if (iVar1 == 1) {
            pGVar5 = Gia_ObjFanin0(pCtrl);
            pGVar5 = Gia_ObjFanin1(pGVar5);
            Jf_ObjSetUnit(pGVar5);
            pGVar5 = Gia_ObjFanin1(pCtrl);
            pGVar5 = Gia_ObjFanin1(pGVar5);
            Jf_ObjSetUnit(pGVar5);
            pGVar5 = Gia_ObjFanin1(pCtrl);
            Jf_ObjCleanUnit(pGVar5);
            *(int *)&p->pSibls = *(int *)&p->pSibls + 1;
          }
        }
        local_44 = local_44 + 1;
      }
    }
    iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj);
    pfVar6 = (float *)malloc((long)iVar1 << 2);
    for (local_44 = 0; iVar1 = Gia_ManObjNum((Gia_Man_t *)pObj), local_44 < iVar1;
        local_44 = local_44 + 1) {
      iVar1 = Abc_MaxInt(1,*(int *)(*(long *)(pObj + 0xc) + (long)local_44 * 4));
      pfVar6[local_44] = (float)iVar1;
    }
    return pfVar6;
  }
  __assert_fail("p->pRefs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                ,0xfa,"float *Jf_ManInitRefs(Jf_Man_t *)");
}

Assistant:

float * Jf_ManInitRefs( Jf_Man_t * pMan )
{
    Gia_Man_t * p = pMan->pGia;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1;
    float * pRes; int i;
    assert( p->pRefs == NULL );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_ObjRefFanin0Inc( p, pObj );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        Gia_ObjRefFanin1Inc( p, pObj );
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        // discount XOR/MUX
        pCtrl = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        Gia_ObjRefDec( p, Gia_Regular(pCtrl) );
        if ( Gia_Regular(pData1) == Gia_Regular(pData0) )
            Gia_ObjRefDec( p, Gia_Regular(pData1) );
    }
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjRefFanin0Inc( p, pObj );
    // mark XOR/MUX internal nodes, which are not used elsewhere
    if ( pMan->pPars->fCoarsen )
    {
        pMan->nCoarse = 0;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 )
            {
                Jf_ObjSetUnit(Gia_ObjFanin0(Gia_ObjFanin0(pObj)));
                Jf_ObjSetUnit(Gia_ObjFanin0(Gia_ObjFanin1(pObj)));
                Jf_ObjCleanUnit(Gia_ObjFanin0(pObj)), pMan->nCoarse++;
            }
            if ( Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1 )
            {
                Jf_ObjSetUnit(Gia_ObjFanin1(Gia_ObjFanin0(pObj)));
                Jf_ObjSetUnit(Gia_ObjFanin1(Gia_ObjFanin1(pObj)));
                Jf_ObjCleanUnit(Gia_ObjFanin1(pObj)), pMan->nCoarse++;
            }
        }
    }
    // multiply by factor
    pRes = ABC_ALLOC( float, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        pRes[i] = Abc_MaxInt( 1, p->pRefs[i] );
    return pRes;
}